

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-loader.cc
# Opt level: O2

expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::image::GetImageInfoFromMemory
            (expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,uint8_t *addr,size_t sz,string *uri)

{
  stbi__context *psVar1;
  bool bVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  stbi__uint32 sVar8;
  uint uVar9;
  int iVar10;
  stbi__uint32 sVar11;
  uint32_t uVar12;
  stbi__jpeg *z;
  stbi__gif *g;
  void *pvVar13;
  long lVar14;
  uint is_grey;
  char *pcVar15;
  char *__nptr;
  long *in_FS_OFFSET;
  stbi__uint32 local_584;
  uint32_t local_580;
  stbi__uint32 local_57c;
  ulong local_578;
  char *local_570;
  stbi__context local_568;
  ImageInfoResult ret;
  string err;
  char buffer [1024];
  
  ret.warning._M_dataplus._M_p = (pointer)&ret.warning.field_2;
  ret.warning._M_string_length = 0;
  ret.warning.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  iVar7 = IsEXRFromMemory(addr,sz);
  if (iVar7 == 0) {
    buffer._0_8_ = anon_var_dwarf_e8e220;
    nonstd::expected_lite::
    expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)buffer);
    goto LAB_0033c471;
  }
  local_57c = 0;
  local_584 = 0;
  local_580 = 0;
  local_568.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_568.read_from_callbacks = 0;
  local_568.callback_already_read = 0;
  local_568.img_buffer_end = addr + (int)sz;
  local_568.img_buffer = addr;
  local_568.img_buffer_original = addr;
  local_568.img_buffer_original_end = local_568.img_buffer_end;
  z = (stbi__jpeg *)calloc(1,0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -8) = "outofmem";
LAB_0033bed1:
    buffer._0_8_ = &local_568;
    iVar7 = stbi__png_info_raw((stbi__png *)buffer,(int *)&local_57c,(int *)&local_584,
                               (int *)&local_580);
    if (iVar7 != 0) goto LAB_0033bef9;
    g = (stbi__gif *)malloc(0x8870);
    if (g != (stbi__gif *)0x0) {
      iVar7 = stbi__gif_header(&local_568,g,(int *)&local_580,1);
      if (iVar7 == 0) {
        free(g);
        local_568.img_buffer = local_568.img_buffer_original;
        local_568.img_buffer_end = local_568.img_buffer_original_end;
        goto LAB_0033bfd4;
      }
      sVar8 = g->w;
      local_584 = g->h;
      free(g);
      bVar2 = false;
      goto LAB_0033bf01;
    }
    *(char **)(*in_FS_OFFSET + -8) = "outofmem";
LAB_0033bfd4:
    buffer[0x1c] = -1;
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    pvVar13 = stbi__bmp_parse_header(&local_568,(stbi__bmp_data *)buffer);
    if (pvVar13 != (void *)0x0) {
      local_57c = local_568.img_x;
      local_584 = local_568.img_y;
      local_580 = 4 - (buffer._24_4_ == 0 || buffer._24_4_ == -0x1000000 && buffer._0_4_ == 0x18);
      goto LAB_0033bef9;
    }
    local_568.img_buffer = local_568.img_buffer_original;
    local_568.img_buffer_end = local_568.img_buffer_original_end;
    sVar8 = stbi__get32be(&local_568);
    if ((sVar8 == 0x38425053) && (iVar7 = stbi__get16be(&local_568), iVar7 == 1)) {
      stbi__skip(&local_568,6);
      uVar9 = stbi__get16be(&local_568);
      if (uVar9 < 0x11) {
        local_584 = stbi__get32be(&local_568);
        local_57c = stbi__get32be(&local_568);
        iVar7 = stbi__get16be(&local_568);
        if (((iVar7 == 0x10) || (iVar7 == 8)) && (iVar7 = stbi__get16be(&local_568), iVar7 == 3)) {
          local_580 = 4;
          goto LAB_0033bef9;
        }
      }
    }
    local_568.img_buffer = local_568.img_buffer_original;
    local_568.img_buffer_end = local_568.img_buffer_original_end;
    iVar7 = stbi__pic_is4(&local_568,anon_var_dwarf_e8f3fc);
    if (iVar7 != 0) {
      stbi__skip(&local_568,0x58);
      local_57c = stbi__get16be(&local_568);
      local_584 = stbi__get16be(&local_568);
      iVar7 = stbi__at_eof(&local_568);
      if ((iVar7 != 0) ||
         ((local_57c != 0 && ((int)(0x10000000 / (long)(int)local_57c) < (int)local_584))))
      goto LAB_0033c129;
      stbi__skip(&local_568,8);
      bVar5 = 0;
      iVar7 = 0xb;
      do {
        iVar7 = iVar7 + -1;
        if (iVar7 == 0) goto LAB_0033c139;
        sVar3 = stbi__get8(&local_568);
        sVar4 = stbi__get8(&local_568);
        local_578 = CONCAT71(local_578._1_7_,sVar4);
        stbi__get8(&local_568);
        bVar6 = stbi__get8(&local_568);
        iVar10 = stbi__at_eof(&local_568);
        if (((char)local_578 != '\b') || (iVar10 != 0)) goto LAB_0033c129;
        bVar5 = bVar5 | bVar6;
      } while (sVar3 != '\0');
      local_580 = 4 - ((bVar5 & 0x10) == 0);
LAB_0033c156:
      bVar2 = false;
      sVar8 = local_57c;
      goto LAB_0033bf01;
    }
LAB_0033c129:
    local_568.img_buffer = local_568.img_buffer_original;
    local_568.img_buffer_end = local_568.img_buffer_original_end;
LAB_0033c139:
    iVar7 = stbi__pnm_info(&local_568,(int *)&local_57c,(int *)&local_584,(int *)&local_580);
    if (iVar7 != 0) goto LAB_0033c156;
    iVar7 = stbi__hdr_test(&local_568);
    if (iVar7 != 0) {
      bVar2 = false;
      while( true ) {
        stbi__hdr_gettoken(&local_568,buffer);
        if (buffer[0] == '\0') break;
        iVar7 = bcmp(buffer,"FORMAT=32-bit_rle_rgbe",0x17);
        if (iVar7 == 0) {
          bVar2 = true;
        }
      }
      if (bVar2) {
        stbi__hdr_gettoken(&local_568,buffer);
        iVar7 = bcmp(buffer,"-Y ",3);
        if (iVar7 == 0) {
          local_570 = buffer + 3;
          lVar14 = strtol(local_570,&local_570,10);
          local_584 = (stbi__uint32)lVar14;
          __nptr = local_570 + 2;
          do {
            pcVar15 = __nptr;
            __nptr = pcVar15 + 1;
          } while (pcVar15[-2] == ' ');
          if (((pcVar15[-2] == '+') && (pcVar15[-1] == 'X')) && (*pcVar15 == ' ')) {
            bVar2 = false;
            local_570 = __nptr;
            lVar14 = strtol(__nptr,(char **)0x0,10);
            local_580 = 3;
            sVar8 = (stbi__uint32)lVar14;
            goto LAB_0033bf01;
          }
        }
      }
    }
    local_568.img_buffer = local_568.img_buffer_original;
    local_568.img_buffer_end = local_568.img_buffer_original_end;
    stbi__get8(&local_568);
    bVar5 = stbi__get8(&local_568);
    if (1 < bVar5) {
LAB_0033c33a:
      *(char **)(*in_FS_OFFSET + -8) = "unknown image type";
      bVar2 = true;
      sVar8 = local_57c;
      goto LAB_0033bf01;
    }
    bVar6 = stbi__get8(&local_568);
    if (bVar5 == 1) {
      if ((bVar6 & 0xf7) == 1) {
        iVar7 = 4;
        stbi__skip(&local_568,4);
        bVar5 = stbi__get8(&local_568);
        if ((bVar5 < 0x21) &&
           (local_578 = (ulong)bVar5, (0x101018100U >> (local_578 & 0x3f) & 1) != 0))
        goto LAB_0033c3c4;
      }
      goto LAB_0033c33a;
    }
    if ((bVar6 & 0xf6) != 2) goto LAB_0033c33a;
    local_578 = 0;
    iVar7 = 9;
LAB_0033c3c4:
    stbi__skip(&local_568,iVar7);
    sVar8 = stbi__get16le(&local_568);
    if ((sVar8 == 0) || (sVar11 = stbi__get16le(&local_568), sVar11 == 0)) goto LAB_0033c33a;
    bVar5 = stbi__get8(&local_568);
    stbi__get8(&local_568);
    if ((uint)local_578 == 0) {
      uVar9 = (uint)bVar5;
      is_grey = (uint)((bVar6 & 0xf7) == 3);
    }
    else {
      if ((bVar5 != 0x10) && (bVar5 != 8)) goto LAB_0033c33a;
      is_grey = 0;
      uVar9 = (uint)local_578;
    }
    uVar12 = stbi__tga_get_comp(uVar9,is_grey,(int *)0x0);
    if (uVar12 == 0) goto LAB_0033c33a;
  }
  else {
    z->s = &local_568;
    iVar7 = stbi__decode_jpeg_header(z,2);
    psVar1 = z->s;
    if (iVar7 == 0) {
      psVar1->img_buffer = psVar1->img_buffer_original;
      psVar1->img_buffer_end = psVar1->img_buffer_original_end;
    }
    else {
      local_57c = psVar1->img_x;
      local_584 = psVar1->img_y;
      local_580 = (uint)(2 < psVar1->img_n) * 2 + 1;
    }
    free(z);
    if (iVar7 == 0) goto LAB_0033bed1;
LAB_0033bef9:
    bVar2 = false;
    sVar8 = local_57c;
LAB_0033bf01:
    if ((int)sVar8 < 1) {
      sVar8 = 0;
    }
    sVar11 = local_584;
    if ((int)local_584 < 1) {
      sVar11 = 0;
    }
    uVar12 = 0;
    if (0 < (int)local_580) {
      uVar12 = local_580;
    }
    if (bVar2) {
      ::std::__cxx11::string::string((string *)buffer,(string *)&err);
      nonstd::expected_lite::
      expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)buffer);
      ::std::__cxx11::string::_M_dispose();
      goto LAB_0033c471;
    }
  }
  ret.width = sVar8;
  ret.height = sVar11;
  ret.channels = uVar12;
  nonstd::expected_lite::
  expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<tinyusdz::image::ImageInfoResult,_0>(__return_storage_ptr__,&ret);
LAB_0033c471:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<image::ImageInfoResult, std::string> GetImageInfoFromMemory(
    const uint8_t *addr, size_t sz, const std::string &uri) {
  image::ImageInfoResult ret;
  std::string err;

#if defined(TINYUSDZ_WITH_EXR)
  if (TINYEXR_SUCCESS == IsEXRFromMemory(addr, sz)) {

    return nonstd::make_unexpected("TODO: EXR format");
  }
#endif

#if defined(TINYUSDZ_WITH_TIFF)
  if (tinydng::IsDNGFromMemory(reinterpret_cast<const char *>(addr), uint32_t(sz), &err)) {

      return nonstd::make_unexpected("TODO: TIFF/DNG format");

  }
#endif

#if defined(TINYUSDZ_USE_WUFFS_IMAGE_LOADER)
  bool ok = GetImageInfoWUFF(addr, sz, uri, &ret.width, &ret.height, &ret.channels, &ret.warning, &err);
#elif !defined(TINYUSDZ_NO_BUILTIN_IMAGE_LOADER)
  bool ok = GetImageInfoSTB(addr, sz, uri, &ret.width, &ret.height, &ret.channels, &ret.warning, &err);
#else
  (void)addr;
  (void)sz;
  (void)uri;
  bool ok = false;
  err = "Image loading feature is disabled in this build. TODO: use user-supplied image info function\n";
#endif
  if (!ok) {
    return nonstd::make_unexpected(err);
  }

  return std::move(ret);
}